

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<unsigned_int,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,uint *params,char (*params_1) [2])

{
  ArrayPtr<const_char> local_40;
  CappedArray<char,_14UL> local_30;
  
  toCharSequence<unsigned_int>(&local_30,(uint *)this);
  local_40 = toCharSequence<char_const(&)[2]>((char (*) [2])params);
  _::concat<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,(CappedArray<char,_14UL> *)&local_40,&local_40);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}